

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O2

unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
 __thiscall anon_unknown.dwarf_5278::testImageFilebuf(anon_unknown_dwarf_5278 *this,string *name)

{
  char cVar1;
  long *local_40;
  string imagePath;
  
  std::__cxx11::string::string
            ((string *)&imagePath,(string *)&(anonymous_namespace)::testImagesPath_abi_cxx11_);
  std::__cxx11::string::push_back((char)&imagePath);
  std::__cxx11::string::append((string *)&imagePath);
  std::make_unique<std::filebuf>();
  std::filebuf::open((char *)local_40,(_Ios_Openmode)imagePath._M_dataplus._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    *(undefined8 *)this = 0;
    if (local_40 != (long *)0x0) {
      (**(code **)(*local_40 + 8))(local_40);
    }
  }
  else {
    *(long **)this = local_40;
  }
  std::__cxx11::string::~string((string *)&imagePath);
  return (__uniq_ptr_data<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<std::streambuf> testImageFilebuf(std::string name)
{
    std::string imagePath{testImagesPath};
    imagePath += '/';
    imagePath += name;
    
    auto filebuf = std::make_unique<std::filebuf>();
    filebuf->open(imagePath, std::ios::in | std::ios::binary);
    if (filebuf->is_open())
    {
        return filebuf;
    }
    return nullptr;
}